

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_expression.hpp
# Opt level: O0

size_t jsoncons::jsonpath::
       remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
                 basic_string_view<char,_std::char_traits<char>_> *path_string)

{
  bool bVar1;
  size_t sVar2;
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  *in_RDI;
  result_options in_stack_0000001c;
  const_reference in_stack_00000020;
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_00000028;
  size_t n;
  basic_json_location<char,_std::allocator<char>_> *location;
  iterator __end2;
  iterator __begin2;
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  *__range2;
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  locations;
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  expr;
  size_t count;
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff08;
  __normal_iterator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_*,_std::vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff10;
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *this;
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  *this_00;
  __normal_iterator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_*,_std::vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>_>
  local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [40];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *local_18;
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  *local_8;
  
  local_18 = (jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
              *)0x0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  local_8 = in_RDI;
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  custom_functions((custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)0x6c0cb9);
  make_expression<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((string_view_type *)expr.expr_._0_8_,
             (custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)expr.const_expr_._16_8_);
  custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  ~custom_functions((custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)0x6c0cdf);
  operator|(nodups,sort_descending);
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::select_paths(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  local_a8 = local_a0;
  local_b0._M_current =
       (basic_json_location<char,_std::allocator<char>_> *)
       std::
       vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffff08);
  std::
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  ::end(in_stack_ffffffffffffff08);
  this_00 = local_8;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff10,
                       (__normal_iterator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_*,_std::vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_*,_std::vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>_>
    ::operator*(&local_b0);
    sVar2 = remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)n,
                       (basic_json_location<char,_std::allocator<char>_> *)in_stack_00000028);
    local_18 = (jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                *)(&local_18->field_0x0 + sVar2);
    __gnu_cxx::
    __normal_iterator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_*,_std::vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>_>
    ::operator++(&local_b0);
  }
  this = local_18;
  std::
  vector<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>,_std::allocator<jsoncons::jsonpath::basic_json_location<char,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::~jsonpath_expression(this);
  return (size_t)this;
}

Assistant:

std::size_t remove(Json& root, const jsoncons::basic_string_view<typename Json::char_type>& path_string)
    {
        std::size_t count = 0;

        auto expr = jsonpath::make_expression<Json>(path_string);
        std::vector<jsonpath::json_location> locations = expr.select_paths(root,
            jsonpath::result_options::nodups | jsonpath::result_options::sort_descending);

        for (const auto& location : locations)
        {
            std::size_t n = jsonpath::remove(root, location);
            count += n;
        }
        return count;
    }